

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O3

void __thiscall sentencepiece::ModelProto::CheckTypeAndMergeFrom(ModelProto *this,MessageLite *from)

{
  if (from->_vptr_MessageLite != (_func_int **)&PTR__ModelProto_0020c930) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "src/../third_party/protobuf-lite/google/protobuf/stubs/casts.h",0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const sentencepiece::ModelProto *, From = const google::protobuf::MessageLite]"
                 );
  }
  MergeFrom(this,(ModelProto *)from);
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}